

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v6::internal::
arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::init(arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  val;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  val_00;
  bool bVar2;
  int iVar3;
  type tVar4;
  type tVar5;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *this_00;
  ulong uVar6;
  entry *peVar7;
  type type;
  int n;
  int i_1;
  type arg_type;
  int i;
  entry *this_01;
  entry *local_78;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar8;
  undefined8 in_stack_ffffffffffffffc8;
  int local_20;
  
  if (this->map_ == (entry *)0x0) {
    iVar3 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            ::max_size(in_stack_ffffffffffffff90);
    tVar4 = to_unsigned<int>(iVar3);
    this_00 = (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               *)CONCAT44(0,tVar4);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this_00;
    uVar6 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    peVar7 = (entry *)operator_new__(uVar6);
    if (this_00 !=
        (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         *)0x0) {
      this_01 = peVar7 + (long)this_00;
      local_78 = peVar7;
      do {
        entry::entry(this_01);
        local_78 = local_78 + 1;
      } while (local_78 != this_01);
    }
    this->map_ = peVar7;
    bVar2 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            ::is_packed((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                         *)ctx);
    if (bVar2) {
      local_20 = 0;
      while( true ) {
        tVar5 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                ::type((basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)ctx,local_20);
        this = (arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                *)(ulong)tVar5;
        if (tVar5 == none_type) break;
        if (tVar5 == named_arg_type) {
          val.field_0.long_long_value._4_4_ = in_stack_ffffffffffffffc4;
          val.field_0.int_value = in_stack_ffffffffffffffc0;
          val.field_0.string.size = *(undefined8 *)(*(long *)(ctx + 8) + (long)local_20 * 0x10);
          push_back((arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),val);
        }
        local_20 = local_20 + 1;
      }
    }
    else {
      uVar8 = 0;
      iVar3 = basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              ::max_size(this_00);
      for (; this = (arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)(ulong)uVar8, (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
        if (*(int *)(*(long *)(ctx + 8) + (long)(int)uVar8 * 0x20 + 0x10) == 1) {
          val_00.field_0.long_long_value._4_4_ = uVar8;
          val_00.field_0.int_value = iVar3;
          val_00.field_0.string.size = in_stack_ffffffffffffffc8;
          push_back((arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)CONCAT44(1,in_stack_ffffffffffffffb8),val_00);
        }
      }
    }
  }
  return (int)this;
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context>& args) {
  if (map_) return;
  map_ = new entry[internal::to_unsigned(args.max_size())];
  if (args.is_packed()) {
    for (int i = 0;; ++i) {
      internal::type arg_type = args.type(i);
      if (arg_type == internal::type::none_type) return;
      if (arg_type == internal::type::named_arg_type)
        push_back(args.values_[i]);
    }
  }
  for (int i = 0, n = args.max_size(); i < n; ++i) {
    auto type = args.args_[i].type_;
    if (type == internal::type::named_arg_type) push_back(args.args_[i].value_);
  }
}